

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-error.c
# Opt level: O1

int run_test_tcp_connect_error_fault(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined1 *puVar2;
  undefined8 uVar3;
  char garbage [60];
  uv_tcp_t server;
  uv_connect_t req;
  char local_1a8 [72];
  undefined1 local_160 [248];
  undefined1 local_68 [96];
  
  builtin_strncpy(local_1a8 + 0x30,"h blah blah",0xc);
  builtin_strncpy(local_1a8 + 0x20,"ah blah blah bla",0x10);
  builtin_strncpy(local_1a8 + 0x10,"lah blah blah bl",0x10);
  builtin_strncpy(local_1a8,"blah blah blah b",0x10);
  puVar2 = (undefined1 *)uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,local_160);
  if (iVar1 == 0) {
    puVar2 = local_68;
    iVar1 = uv_tcp_connect(puVar2,local_160,local_1a8,connect_cb);
    if (iVar1 != -0x16) goto LAB_001720b8;
    uv_close(local_160,close_cb);
    puVar2 = (undefined1 *)uv_default_loop();
    uv_run(puVar2,0);
    if (connect_cb_called != 0) goto LAB_001720bd;
    if (close_cb_called == 1) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      puVar2 = (undefined1 *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001720c7;
    }
  }
  else {
    run_test_tcp_connect_error_fault_cold_1();
LAB_001720b8:
    run_test_tcp_connect_error_fault_cold_2();
LAB_001720bd:
    run_test_tcp_connect_error_fault_cold_3();
  }
  run_test_tcp_connect_error_fault_cold_4();
LAB_001720c7:
  run_test_tcp_connect_error_fault_cold_5();
  if (puVar2 != (undefined1 *)0x0) {
    connect_cb_called = connect_cb_called + 1;
    return extraout_EAX;
  }
  connect_cb_cold_1();
  if (puVar2 != (undefined1 *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_00;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar2,0);
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_connect_error_fault) {
  const char garbage[] =
      "blah blah blah blah blah blah blah blah blah blah blah blah";
  const struct sockaddr_in* garbage_addr;
  uv_tcp_t server;
  int r;
  uv_connect_t req;

  garbage_addr = (const struct sockaddr_in*) &garbage;

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_tcp_connect(&req,
                     &server,
                     (const struct sockaddr*) garbage_addr,
                     connect_cb);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(connect_cb_called == 0);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}